

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::InstrumentPass::GetVoidId(InstrumentPass *this)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Type *type;
  Void void_ty;
  Type local_40;
  
  if (this->void_id_ != 0) {
    return this->void_id_;
  }
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_40._28_8_ = 0;
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_40._vptr_Type = (_func_int **)&PTR__Type_003aeaf0;
  type = analysis::TypeManager::GetRegisteredType(this_00,&local_40);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,type);
  this->void_id_ = uVar1;
  analysis::Type::~Type(&local_40);
  return this->void_id_;
}

Assistant:

uint32_t InstrumentPass::GetVoidId() {
  if (void_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Void void_ty;
    analysis::Type* reg_void_ty = type_mgr->GetRegisteredType(&void_ty);
    void_id_ = type_mgr->GetTypeInstruction(reg_void_ty);
  }
  return void_id_;
}